

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O0

char * google::protobuf::internal::TcParser::FastMtS1
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  undefined8 *puVar1;
  ParseContext *pPVar2;
  ZeroCopyInputStream *pZVar3;
  long lVar4;
  ParseContext *pPVar5;
  uchar uVar6;
  byte bVar7;
  bool bVar8;
  uint16_t uVar9;
  unsigned_short uVar10;
  uint uVar11;
  uint32_t uVar12;
  int v1;
  int v2;
  char *pcVar13;
  uint *puVar14;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar15;
  FieldAux *pFVar16;
  MessageLite *pMVar17;
  TcParseTableBase *pTVar18;
  ulong uVar19;
  TailCallParseFunc p_Var20;
  LogMessage *pLVar21;
  uint64_t hasbits_local;
  TcParseTableBase *table_local;
  ParseContext *ctx_local;
  char *ptr_local;
  MessageLite *msg_local;
  TcFieldData data_local;
  anon_class_24_3_cc722eaf inner_loop;
  TcParseTableBase *inner_table;
  FieldAux aux;
  MessageLite **field;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_1c0;
  uchar saved_tag;
  uint64_t local_1b8;
  TcParseTableBase *local_1b0;
  ParseContext *local_1a8;
  ZeroCopyInputStream *local_1a0;
  MessageLite *local_198;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_190 [2];
  uint local_17c;
  TcParseTableBase *pTStack_178;
  uint32_t has_bits_offset;
  ulong local_170;
  MessageLite *local_168;
  Arena *local_160;
  TcParseTableBase *local_158;
  LimitToken local_14c;
  undefined1 local_148 [16];
  LogMessageFatal local_138 [23];
  Voidify local_121;
  string *local_120;
  string *absl_log_internal_check_op_result;
  undefined4 local_110;
  int old_depth;
  LimitToken local_fc;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 *paStack_f8;
  LimitToken old;
  ZeroCopyInputStream *local_e0;
  undefined1 local_c8 [12];
  int size;
  ZeroCopyInputStream *local_b8;
  ParseContext *local_b0;
  ZeroCopyInputStream *local_a8;
  ZeroCopyInputStream *local_a0;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 *local_98;
  TcFieldData local_90;
  long local_88;
  ParseContext *local_80;
  ZeroCopyInputStream *local_78;
  MessageLite *local_70;
  ZeroCopyInputStream *local_68;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_60;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_58;
  TcFieldData data_1;
  FastFieldEntry *fast_entry;
  size_t idx;
  unsigned_short coded_tag;
  
  local_1b8 = hasbits;
  local_1b0 = table;
  local_1a8 = ctx;
  local_1a0 = (ZeroCopyInputStream *)ptr;
  local_198 = msg;
  local_190[0] = data.field_0;
  uVar6 = TcFieldData::coded_tag<unsigned_char>((TcFieldData *)local_190);
  pMVar17 = local_198;
  pZVar3 = local_1a0;
  pPVar2 = local_1a8;
  if (uVar6 != '\0') {
    TcFieldData::TcFieldData((TcFieldData *)&stack0xfffffffffffffe40);
    pcVar13 = MiniParse(pMVar17,(char *)pZVar3,pPVar2,(TcFieldData)aStack_1c0,local_1b0,local_1b8);
    return pcVar13;
  }
  UnalignedLoad<unsigned_char>((char *)local_1a0);
  local_1a0 = (ZeroCopyInputStream *)((long)local_1a0 + 1);
  bVar7 = TcFieldData::hasbit_idx((TcFieldData *)local_190);
  local_1b8 = 1L << (bVar7 & 0x3f) | local_1b8;
  local_168 = local_198;
  pTStack_178 = local_1b0;
  local_17c = (uint)local_1b0->has_bits_offset;
  local_170 = local_1b8;
  if (local_17c != 0) {
    uVar11 = (uint)local_1b8;
    puVar14 = RefAt<unsigned_int>(local_198,(ulong)local_17c);
    *puVar14 = uVar11 | *puVar14;
  }
  pMVar17 = local_198;
  uVar9 = TcFieldData::offset((TcFieldData *)local_190);
  aVar15 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
           RefAt<google::protobuf::MessageLite*>(pMVar17,(ulong)uVar9);
  pTVar18 = local_1b0;
  bVar7 = TcFieldData::aux_idx((TcFieldData *)local_190);
  pFVar16 = TcParseTableBase::field_aux(pTVar18,(uint)bVar7);
  pTVar18 = pFVar16->table;
  inner_loop.inner_table = (TcParseTableBase **)pTVar18;
  if (*(MessageLite **)aVar15 == (MessageLite *)0x0) {
    local_160 = MessageLite::GetArena(local_198);
    local_158 = pTVar18;
    pMVar17 = ClassData::New(pTVar18->class_data,local_160);
    *(MessageLite **)aVar15 = pMVar17;
  }
  pZVar3 = local_1a0;
  pPVar2 = local_1a8;
  inner_loop.field = (MessageLite **)&local_1a8;
  inner_loop.ctx = (ParseContext **)&inner_loop.inner_table;
  paStack_f8 = &data_local.field_0;
  data_local.field_0 = aVar15;
  EpsCopyInputStream::LimitToken::LimitToken(&local_fc);
  local_b0 = pPVar2;
  local_b8 = pZVar3;
  unique0x100004f4 = &local_fc;
  local_c8._4_4_ = ReadSize((char **)&local_b8);
  if ((local_b8 == (ZeroCopyInputStream *)0x0) || (pPVar2->depth_ < 1)) {
    local_a8 = (ZeroCopyInputStream *)0x0;
  }
  else {
    EpsCopyInputStream::PushLimit((EpsCopyInputStream *)local_c8,(char *)pPVar2,(int)local_b8);
    EpsCopyInputStream::LimitToken::operator=(stack0xffffffffffffff40,(LimitToken *)local_c8);
    EpsCopyInputStream::LimitToken::~LimitToken((LimitToken *)local_c8);
    pPVar2->depth_ = pPVar2->depth_ + -1;
    local_a8 = local_b8;
  }
  if (local_a8 == (ZeroCopyInputStream *)0x0) {
    local_e0 = local_a8;
  }
  else {
    absl_log_internal_check_op_result._4_4_ = pPVar2->depth_;
    local_98 = paStack_f8;
    local_a0 = local_a8;
    local_70 = *(MessageLite **)*paStack_f8;
    local_80 = *(ParseContext **)paStack_f8[1];
    local_78 = local_a8;
    local_88 = *(long *)paStack_f8[2] + 0x38;
    while (bVar8 = ParseContext::Done(local_80,(char **)&local_78), pMVar17 = local_70,
          pZVar3 = local_78, pPVar5 = local_80, ((bVar8 ^ 0xffU) & 1) != 0) {
      TcFieldData::TcFieldData(&local_90);
      lVar4 = local_88;
      pTVar18 = (TcParseTableBase *)(local_88 + -0x38);
      uVar10 = UnalignedLoad<unsigned_short>((char *)pZVar3);
      uVar19 = (ulong)(int)((uint)uVar10 & (uint)*(byte *)(lVar4 + -0x30));
      if ((uVar19 & 7) != 0) {
        protobuf_assumption_failed
                  ("(idx & 7) == 0",
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
                   ,0x44d);
      }
      data_1.field_0 =
           (anon_union_8_1_898a9ca8_for_TcFieldData_0)
           TcParseTableBase::fast_entry(pTVar18,uVar19 >> 3);
      local_58.data =
           ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)((long)data_1.field_0 + 8))->data ^
           (ulong)uVar10;
      p_Var20 = TcParseTableBase::FastFieldEntry::target((FastFieldEntry *)data_1.field_0);
      local_60.data = local_58.data;
      local_78 = (ZeroCopyInputStream *)
                 (*p_Var20)(pMVar17,(char *)pZVar3,pPVar5,(TcFieldData)local_58,pTVar18,0);
      if ((local_78 == (ZeroCopyInputStream *)0x0) ||
         (uVar12 = EpsCopyInputStream::LastTag(&local_80->super_EpsCopyInputStream), uVar12 != 1))
      break;
    }
    if ((*(byte *)(local_88 + -0x2f) & 1) == 0) {
      local_68 = local_78;
      local_88 = local_88 + -0x38;
    }
    else {
      puVar1 = (undefined8 *)(local_88 + -0x10);
      local_88 = local_88 + -0x38;
      local_68 = (ZeroCopyInputStream *)(*(code *)*puVar1)(local_70,local_78,local_80);
    }
    local_e0 = local_68;
    if (local_68 != (ZeroCopyInputStream *)0x0) {
      v1 = absl::lts_20240722::log_internal::GetReferenceableValue
                     (absl_log_internal_check_op_result._4_4_);
      v2 = absl::lts_20240722::log_internal::GetReferenceableValue(pPVar2->depth_);
      local_120 = absl::lts_20240722::log_internal::Check_EQImpl_abi_cxx11_
                            (v1,v2,"old_depth == depth_");
      if (local_120 != (string *)0x0) {
        local_148 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_120);
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  (local_138,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/parse_context.h"
                   ,1099,local_148._0_8_,local_148._8_8_);
        pLVar21 = absl::lts_20240722::log_internal::LogMessage::InternalStream
                            ((LogMessage *)local_138);
        absl::lts_20240722::log_internal::Voidify::operator&&(&local_121,pLVar21);
        absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_138);
      }
      local_120 = (string *)0x0;
    }
    pPVar2->depth_ = pPVar2->depth_ + 1;
    EpsCopyInputStream::LimitToken::LimitToken(&local_14c,&local_fc);
    bVar8 = EpsCopyInputStream::PopLimit(&pPVar2->super_EpsCopyInputStream,&local_14c);
    EpsCopyInputStream::LimitToken::~LimitToken(&local_14c);
    if (((bVar8 ^ 0xffU) & 1) == 0) {
    }
    else {
      local_e0 = (ZeroCopyInputStream *)0x0;
    }
  }
  local_110 = 1;
  EpsCopyInputStream::LimitToken::~LimitToken(&local_fc);
  return (char *)local_e0;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastMtS1(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return SingularParseMessageAuxImpl<uint8_t, false, true>(
      PROTOBUF_TC_PARAM_PASS);
}